

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::AdamOptimizer::MergePartialFromCodedStream
          (AdamOptimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  int length;
  uint32 uVar5;
  int iVar6;
  DoubleParameter *this_00;
  Int64Parameter *this_01;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00253a97;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00253a97:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_00253af1_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\n') break;
      this_00 = this->learningrate_;
      if (this_00 == (DoubleParameter *)0x0) {
        this_00 = (DoubleParameter *)operator_new(0x28);
        DoubleParameter::DoubleParameter(this_00);
        this->learningrate_ = this_00;
      }
LAB_00253ba8:
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar4 = DoubleParameter::MergePartialFromCodedStream(this_00,input);
LAB_00253c2d:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar7.first);
      goto LAB_00253c3c;
    case 2:
      if (cVar8 == '\x12') {
        this_01 = this->minibatchsize_;
        if (this_01 == (Int64Parameter *)0x0) {
          this_01 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(this_01);
          this->minibatchsize_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar6 = (int)(char)*puVar3, -1 < iVar6)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = Int64Parameter::MergePartialFromCodedStream(this_01,input);
        goto LAB_00253c2d;
      }
      break;
    case 3:
      if (cVar8 == '\x1a') {
        this_00 = this->beta1_;
        if (this_00 == (DoubleParameter *)0x0) {
          this_00 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(this_00);
          this->beta1_ = this_00;
        }
        goto LAB_00253ba8;
      }
      break;
    case 4:
      if (cVar8 == '\"') {
        this_00 = this->beta2_;
        if (this_00 == (DoubleParameter *)0x0) {
          this_00 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(this_00);
          this->beta2_ = this_00;
        }
        goto LAB_00253ba8;
      }
      break;
    case 5:
      if (cVar8 == '*') {
        this_00 = this->eps_;
        if (this_00 == (DoubleParameter *)0x0) {
          this_00 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(this_00);
          this->eps_ = this_00;
        }
        goto LAB_00253ba8;
      }
    }
switchD_00253af1_default:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00253c3c:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool AdamOptimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.AdamOptimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_learningrate()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_minibatchsize()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter beta1 = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta1()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter beta2 = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta2()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter eps = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eps()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.AdamOptimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.AdamOptimizer)
  return false;
#undef DO_
}